

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O3

shared_ptr<chrono::curiosity::CuriosityWheel> __thiscall
chrono::curiosity::Curiosity::GetWheel(Curiosity *this,CuriosityWheelID id)

{
  undefined8 *puVar1;
  long lVar2;
  undefined8 uVar3;
  uint in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined4 in_register_00000034;
  shared_ptr<chrono::curiosity::CuriosityWheel> sVar5;
  shared_ptr<chrono::curiosity::CuriosityWheel> sVar6;
  
  _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)in_EDX * 0x10);
  puVar1 = (undefined8 *)
           ((long)&_Var4._M_pi[2]._vptr__Sp_counted_base + CONCAT44(in_register_00000034,id));
  uVar3 = puVar1[1];
  lVar2 = *(long *)((long)&_Var4._M_pi[2]._M_use_count + CONCAT44(in_register_00000034,id));
  this->m_system = (ChSystem *)*puVar1;
  *(undefined8 *)&this->m_initialized = uVar3;
  if (lVar2 != 0) {
    _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      sVar5.super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar5.super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)this;
      return (shared_ptr<chrono::curiosity::CuriosityWheel>)
             sVar5.super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>
      ;
    }
    LOCK();
    *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
    UNLOCK();
  }
  sVar6.super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  sVar6.super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::curiosity::CuriosityWheel>)
         sVar6.super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CuriosityWheel> Curiosity::GetWheel(CuriosityWheelID id) const {
    return m_wheels[id];
}